

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cd03::TestXmlTestReporterFixtureSingleFailedTestReportSummaryFormat::RunImpl
          (TestXmlTestReporterFixtureSingleFailedTestReportSummaryFormat *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_1c0 [8];
  XmlTestReporterFixtureSingleFailedTestReportSummaryFormatHelper fixtureHelper;
  bool ctorOk;
  TestXmlTestReporterFixtureSingleFailedTestReportSummaryFormat *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  XmlTestReporterFixtureSingleFailedTestReportSummaryFormatHelper::
  XmlTestReporterFixtureSingleFailedTestReportSummaryFormatHelper
            ((XmlTestReporterFixtureSingleFailedTestReportSummaryFormatHelper *)local_1c0,
             &(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  UnitTest::
  ExecuteTest<(anonymous_namespace)::XmlTestReporterFixtureSingleFailedTestReportSummaryFormatHelper>
            ((XmlTestReporterFixtureSingleFailedTestReportSummaryFormatHelper *)local_1c0,
             &(this->super_Test).m_details);
  XmlTestReporterFixtureSingleFailedTestReportSummaryFormatHelper::
  ~XmlTestReporterFixtureSingleFailedTestReportSummaryFormatHelper
            ((XmlTestReporterFixtureSingleFailedTestReportSummaryFormatHelper *)local_1c0);
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, SingleFailedTestReportSummaryFormat)
{
    TestDetails const details("A Test", "suite", "A File", 4321);

    reporter.ReportTestStart(details);
    reporter.ReportFailure(details, "A Failure");
    reporter.ReportSummary(1, 1, 1, 0.1f);

    const char *expected =
        "<?xml version=\"1.0\"?>"
        "<unittest-results tests=\"1\" failedtests=\"1\" failures=\"1\" time=\"0.1\">"
        "<test suite=\"suite\" name=\"A Test\" time=\"0\">"
        "<failure message=\"A File(4321) : A Failure\"/>"
        "</test>"
        "</unittest-results>";

    CHECK_EQUAL(expected, output.str());
}